

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O0

StringList * __thiscall Args::HelpPrinter::splitToWords(HelpPrinter *this,String *s)

{
  ulong uVar1;
  StringList *in_RDI;
  anon_class_16_2_51562d2c aVar2;
  String word;
  StringList *result;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  string local_38 [56];
  
  __first._M_current = (char *)local_38;
  __last._M_current = (char *)in_RDI;
  std::__cxx11::string::string((string *)__first._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x17cb39);
  std::__cxx11::string::cbegin();
  std::__cxx11::string::cend();
  aVar2.result = in_RDI;
  aVar2.word = (String *)0x17cb8d;
  aVar2 = std::
          for_each<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,Args::HelpPrinter::splitToWords(std::__cxx11::string_const&)const::_lambda(char_const&)_1_>
                    (__first,__last,aVar2);
  aVar2.result = aVar2.result;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(aVar2.result,(value_type *)__first._M_current);
  }
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

inline StringList
HelpPrinter::splitToWords( const String & s ) const
{
	String word;
	StringList result;

	std::for_each( s.cbegin(), s.cend(),
		[ &word, &result ] ( const Char & c )
		{
			if( isSpaceChar( c ) )
			{
				if( !word.empty() )
					result.push_back( word );

				word.clear();
			}
			else
				word.append( 1, c );
		}
	);

	if( !word.empty() )
		result.push_back( word );

	return result;
}